

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall
mkvmuxer::Segment::AddVideoTrack(Segment *this,int32_t width,int32_t height,int32_t number)

{
  bool bVar1;
  VideoTrack *this_00;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  VideoTrack *track;
  uint *in_stack_ffffffffffffff98;
  VideoTrack *in_stack_ffffffffffffffa0;
  VideoTrack *local_48;
  int32_t in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  uint64_t local_8;
  
  this_00 = (VideoTrack *)operator_new(0xf8,(nothrow_t *)&std::nothrow);
  uVar2 = 0;
  local_48 = (VideoTrack *)0x0;
  if (this_00 != (VideoTrack *)0x0) {
    uVar2 = 1;
    VideoTrack::VideoTrack(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_48 = this_00;
  }
  if (local_48 == (VideoTrack *)0x0) {
    local_8 = 0;
  }
  else {
    Track::set_type(&local_48->super_Track,1);
    Track::set_codec_id(&this_00->super_Track,in_RDI);
    VideoTrack::set_width(local_48,(long)in_ESI);
    VideoTrack::set_height(local_48,(long)in_EDX);
    bVar1 = Tracks::AddTrack((Tracks *)local_48,(Track *)CONCAT17(uVar2,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc);
    if (bVar1) {
      in_RDI[0x140] = '\x01';
      local_8 = Track::number(&local_48->super_Track);
    }
    else {
      if (local_48 != (VideoTrack *)0x0) {
        (*(local_48->super_Track)._vptr_Track[1])();
      }
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

uint64_t Segment::AddVideoTrack(int32_t width, int32_t height, int32_t number) {
  VideoTrack* const track = new (std::nothrow) VideoTrack(&seed_);  // NOLINT
  if (!track)
    return 0;

  track->set_type(Tracks::kVideo);
  track->set_codec_id(Tracks::kVp8CodecId);
  track->set_width(width);
  track->set_height(height);

  if (!tracks_.AddTrack(track, number)) {
    delete track;
    return 0;
  }
  has_video_ = true;

  return track->number();
}